

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O3

uint32_t * pack1_16(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint32_t uVar1;
  uint uVar2;
  
  uVar1 = *in;
  *out = uVar1 - base;
  uVar2 = (in[1] - base) * 2 | uVar1 - base;
  *out = uVar2;
  uVar2 = (in[2] - base) * 4 | uVar2;
  *out = uVar2;
  uVar2 = (in[3] - base) * 8 | uVar2;
  *out = uVar2;
  uVar2 = (in[4] - base) * 0x10 | uVar2;
  *out = uVar2;
  uVar2 = (in[5] - base) * 0x20 | uVar2;
  *out = uVar2;
  uVar2 = (in[6] - base) * 0x40 | uVar2;
  *out = uVar2;
  uVar2 = (in[7] - base) * 0x80 | uVar2;
  *out = uVar2;
  uVar2 = (in[8] - base) * 0x100 | uVar2;
  *out = uVar2;
  uVar2 = (in[9] - base) * 0x200 | uVar2;
  *out = uVar2;
  uVar2 = (in[10] - base) * 0x400 | uVar2;
  *out = uVar2;
  uVar2 = (in[0xb] - base) * 0x800 | uVar2;
  *out = uVar2;
  uVar2 = (in[0xc] - base) * 0x1000 | uVar2;
  *out = uVar2;
  uVar2 = (in[0xd] - base) * 0x2000 | uVar2;
  *out = uVar2;
  uVar2 = (in[0xe] - base) * 0x4000 | uVar2;
  *out = uVar2;
  *out = (in[0xf] - base) * 0x8000 | uVar2;
  return out + 1;
}

Assistant:

uint32_t * pack1_16( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out =  static_cast<uint32_t>((*in) -base)  ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  1 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  2 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  3 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  4 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  5 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  6 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  7 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  8 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  9 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  10 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  11 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  12 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  13 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  14 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  15 ;
    ++in;

    return out + 1;
}